

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O2

char * telnet_init(BackendVtable *vt,Seat *seat,Backend **backend_handle,LogContext *logctx,
                  Conf *conf,char *host,int port,char **realhost,_Bool nodelay,_Bool keepalive)

{
  Opt *pOVar1;
  _Bool _Var2;
  int iVar3;
  Opt **o;
  Telnet *telnet;
  Conf *pCVar4;
  strbuf *psVar5;
  char *pcVar6;
  SockAddr *addr;
  Socket *pSVar7;
  Pinger *pPVar8;
  Opt **ppOVar9;
  Opt **o_1;
  
  telnet = (Telnet *)safemalloc(1,200,0);
  memset(telnet,0,200);
  (telnet->plug).vt = &Telnet_plugvt;
  (telnet->backend).vt = vt;
  (telnet->interactor).vt = &Telnet_interactorvt;
  (telnet->backend).interactor = &telnet->interactor;
  pCVar4 = conf_copy(conf);
  telnet->conf = pCVar4;
  telnet->s = (Socket *)0x0;
  telnet->socket_connected = false;
  telnet->closed_on_socket_error = false;
  telnet->echoing = true;
  telnet->editing = true;
  telnet->activated = false;
  psVar5 = strbuf_new();
  telnet->sb_buf = psVar5;
  telnet->seat = seat;
  telnet->logctx = logctx;
  iVar3 = conf_get_int(telnet->conf,0x7d);
  telnet->term_width = iVar3;
  iVar3 = conf_get_int(telnet->conf,0x7e);
  telnet->term_height = iVar3;
  telnet->state = TOP_LEVEL;
  telnet->ldisc = (Ldisc *)0x0;
  telnet->pinger = (Pinger *)0x0;
  pcVar6 = default_description(vt,host,port);
  telnet->description = pcVar6;
  *backend_handle = &telnet->backend;
  iVar3 = conf_get_int(telnet->conf,3);
  addr = name_lookup(host,port,realhost,telnet->conf,iVar3,telnet->logctx,"Telnet connection");
  pcVar6 = sk_addr_error(addr);
  if (pcVar6 == (char *)0x0) {
    iVar3 = 0x17;
    if (-1 < port) {
      iVar3 = port;
    }
    pSVar7 = new_connection(addr,*realhost,iVar3,false,true,nodelay,keepalive,&telnet->plug,
                            telnet->conf,&telnet->interactor);
    telnet->s = pSVar7;
    pcVar6 = (*pSVar7->vt->socket_error)(pSVar7);
    if (pcVar6 == (char *)0x0) {
      (*telnet->seat->vt->set_trust_status)(telnet->seat,false);
      pPVar8 = pinger_new(telnet->conf,&telnet->backend);
      telnet->pinger = pPVar8;
      _Var2 = conf_get_bool(telnet->conf,0x3d);
      if (_Var2) {
        for (ppOVar9 = opts; *ppOVar9 != (Opt *)0x0; ppOVar9 = ppOVar9 + 1) {
          telnet->opt_states[(*ppOVar9)->index] = 2;
        }
      }
      else {
        for (ppOVar9 = opts; pOVar1 = *ppOVar9, pOVar1 != (Opt *)0x0; ppOVar9 = ppOVar9 + 1) {
          telnet->opt_states[pOVar1->index] = pOVar1->initial_state;
          if (telnet->opt_states[pOVar1->index] == 0) {
            send_opt(telnet,pOVar1->send,pOVar1->option);
          }
        }
        telnet->activated = true;
      }
      telnet->in_synch = false;
      (*telnet->seat->vt->update_specials_menu)(telnet->seat);
      pcVar6 = conf_get_str(telnet->conf,9);
      if (*pcVar6 != '\0') {
        safefree(*realhost);
        pcVar6 = dupstr(pcVar6);
        *realhost = pcVar6;
        pcVar6 = host_strrchr(pcVar6,0x3a);
        if (pcVar6 != (char *)0x0) {
          *pcVar6 = '\0';
        }
      }
      return (char *)0x0;
    }
  }
  else {
    sk_addr_free(addr);
  }
  pcVar6 = dupstr(pcVar6);
  return pcVar6;
}

Assistant:

static char *telnet_init(const BackendVtable *vt, Seat *seat,
                         Backend **backend_handle, LogContext *logctx,
                         Conf *conf, const char *host, int port,
                         char **realhost, bool nodelay, bool keepalive)
{
    SockAddr *addr;
    const char *err;
    Telnet *telnet;
    char *loghost;
    int addressfamily;

    telnet = snew(Telnet);
    memset(telnet, 0, sizeof(Telnet));
    telnet->plug.vt = &Telnet_plugvt;
    telnet->backend.vt = vt;
    telnet->interactor.vt = &Telnet_interactorvt;
    telnet->backend.interactor = &telnet->interactor;
    telnet->conf = conf_copy(conf);
    telnet->s = NULL;
    telnet->socket_connected = false;
    telnet->closed_on_socket_error = false;
    telnet->echoing = true;
    telnet->editing = true;
    telnet->activated = false;
    telnet->sb_buf = strbuf_new();
    telnet->seat = seat;
    telnet->logctx = logctx;
    telnet->term_width = conf_get_int(telnet->conf, CONF_width);
    telnet->term_height = conf_get_int(telnet->conf, CONF_height);
    telnet->state = TOP_LEVEL;
    telnet->ldisc = NULL;
    telnet->pinger = NULL;
    telnet->description = default_description(vt, host, port);
    *backend_handle = &telnet->backend;

    /*
     * Try to find host.
     */
    addressfamily = conf_get_int(telnet->conf, CONF_addressfamily);
    addr = name_lookup(host, port, realhost, telnet->conf, addressfamily,
                       telnet->logctx, "Telnet connection");
    if ((err = sk_addr_error(addr)) != NULL) {
        sk_addr_free(addr);
        return dupstr(err);
    }

    if (port < 0)
        port = 23;                     /* default telnet port */

    /*
     * Open socket.
     */
    telnet->s = new_connection(addr, *realhost, port, false, true, nodelay,
                               keepalive, &telnet->plug, telnet->conf,
                               &telnet->interactor);
    if ((err = sk_socket_error(telnet->s)) != NULL)
        return dupstr(err);

    /* No local authentication phase in this protocol */
    seat_set_trust_status(telnet->seat, false);

    telnet->pinger = pinger_new(telnet->conf, &telnet->backend);

    /*
     * Initialise option states.
     */
    if (conf_get_bool(telnet->conf, CONF_passive_telnet)) {
        const struct Opt *const *o;

        for (o = opts; *o; o++)
            telnet->opt_states[(*o)->index] = INACTIVE;
    } else {
        const struct Opt *const *o;

        for (o = opts; *o; o++) {
            telnet->opt_states[(*o)->index] = (*o)->initial_state;
            if (telnet->opt_states[(*o)->index] == REQUESTED)
                send_opt(telnet, (*o)->send, (*o)->option);
        }
        telnet->activated = true;
    }

    /*
     * Set up SYNCH state.
     */
    telnet->in_synch = false;

    /*
     * We can send special commands from the start.
     */
    seat_update_specials_menu(telnet->seat);

    /*
     * loghost overrides realhost, if specified.
     */
    loghost = conf_get_str(telnet->conf, CONF_loghost);
    if (*loghost) {
        char *colon;

        sfree(*realhost);
        *realhost = dupstr(loghost);

        colon = host_strrchr(*realhost, ':');
        if (colon)
            *colon++ = '\0';
    }

    return NULL;
}